

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

void __thiscall Highs::invalidateModelStatusSolutionAndInfo(Highs *this)

{
  Highs *in_RDI;
  
  invalidateModelStatus(in_RDI);
  invalidateSolution((Highs *)0x492002);
  invalidateRanging((Highs *)0x49200c);
  invalidateInfo((Highs *)0x492016);
  invalidateIis((Highs *)0x492020);
  return;
}

Assistant:

void Highs::invalidateModelStatusSolutionAndInfo() {
  invalidateModelStatus();
  invalidateSolution();
  invalidateRanging();
  invalidateInfo();
  invalidateIis();
}